

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsView::mousePressEvent(QGraphicsView *this,QMouseEvent *event)

{
  QEventStorage<QMouseEvent> *pQVar1;
  QGraphicsViewPrivate *this_00;
  Data *pDVar2;
  qreal qVar3;
  char cVar4;
  bool bVar5;
  MouseEventSource source;
  MouseEventFlags flags;
  QPoint QVar6;
  QWidget *pQVar7;
  QObject *pQVar8;
  long in_FS_OFFSET;
  QPointF QVar9;
  undefined1 local_58 [12];
  char cStack_4c;
  undefined3 uStack_4b;
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsViewPrivate **)(this + 8);
  QGraphicsViewPrivate::storeMouseEvent(this_00,event);
  pQVar1 = &this_00->lastMouseEvent;
  (**(code **)(*(long *)&(this_00->lastMouseEvent).field_0 + 0x10))(pQVar1,0);
  if ((this_00->field_0x300 & 1) != 0) {
    QVar9 = QSinglePointEvent::position((QSinglePointEvent *)event);
    register0x00001240 = (undefined1 *)QVar9.yp;
    local_58._0_8_ = QVar9.xp;
    QVar6 = QPointF::toPoint((QPointF *)local_58);
    this_00->mousePressViewPoint = QVar6;
    QVar9 = mapToScene(this,&this_00->mousePressViewPoint);
    (this_00->mousePressScenePoint).xp = QVar9.xp;
    (this_00->mousePressScenePoint).yp = QVar9.yp;
    QVar9 = QSinglePointEvent::globalPosition((QSinglePointEvent *)event);
    register0x00001240 = (undefined1 *)QVar9.yp;
    local_58._0_8_ = QVar9.xp;
    QVar6 = QPointF::toPoint((QPointF *)local_58);
    this_00->mousePressScreenPoint = QVar6;
    qVar3 = (this_00->mousePressScenePoint).yp;
    (this_00->lastMouseMoveScenePoint).xp = (this_00->mousePressScenePoint).xp;
    (this_00->lastMouseMoveScenePoint).yp = qVar3;
    this_00->lastMouseMoveScreenPoint = QVar6;
    this_00->mousePressButton = *(MouseButton *)(event + 0x40);
    bVar5 = QPointer::operator_cast_to_bool((QPointer *)&this_00->scene);
    if (bVar5) {
      local_48.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xffffffffffffffb0 = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent
                ((QGraphicsSceneMouseEvent *)local_58,GraphicsSceneMousePress);
      pQVar7 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QGraphicsSceneEvent::setWidget((QGraphicsSceneEvent *)local_58,pQVar7);
      QGraphicsSceneMouseEvent::setButtonDownScenePos
                ((QGraphicsSceneMouseEvent *)local_58,this_00->mousePressButton,
                 &this_00->mousePressScenePoint);
      QGraphicsSceneMouseEvent::setButtonDownScreenPos
                ((QGraphicsSceneMouseEvent *)local_58,this_00->mousePressButton,
                 &this_00->mousePressScreenPoint);
      QGraphicsSceneMouseEvent::setScenePos
                ((QGraphicsSceneMouseEvent *)local_58,&this_00->mousePressScenePoint);
      QGraphicsSceneMouseEvent::setScreenPos
                ((QGraphicsSceneMouseEvent *)local_58,&this_00->mousePressScreenPoint);
      QGraphicsSceneMouseEvent::setLastScenePos
                ((QGraphicsSceneMouseEvent *)local_58,&this_00->lastMouseMoveScenePoint);
      QGraphicsSceneMouseEvent::setLastScreenPos
                ((QGraphicsSceneMouseEvent *)local_58,&this_00->lastMouseMoveScreenPoint);
      QGraphicsSceneMouseEvent::setButtons
                ((QGraphicsSceneMouseEvent *)local_58,
                 (QFlagsStorageHelper<Qt::MouseButton,_4>)
                 *(QFlagsStorage<Qt::MouseButton> *)(event + 0x44));
      QGraphicsSceneMouseEvent::setButton
                ((QGraphicsSceneMouseEvent *)local_58,*(MouseButton *)(event + 0x40));
      QGraphicsSceneMouseEvent::setModifiers
                ((QGraphicsSceneMouseEvent *)local_58,
                 (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
                 *(QFlagsStorage<Qt::KeyboardModifier> *)(event + 0x20));
      source = QMouseEvent::source();
      QGraphicsSceneMouseEvent::setSource((QGraphicsSceneMouseEvent *)local_58,source);
      flags.super_QFlagsStorageHelper<Qt::MouseEventFlag,_4>.super_QFlagsStorage<Qt::MouseEventFlag>
      .i = (QFlagsStorageHelper<Qt::MouseEventFlag,_4>)QMouseEvent::flags();
      QGraphicsSceneMouseEvent::setFlags((QGraphicsSceneMouseEvent *)local_58,flags);
      stack0xffffffffffffffb0 = (uint5)(uint)local_58._8_4_;
      QGraphicsSceneEvent::setTimestamp((QGraphicsSceneEvent *)local_58,*(quint64 *)(event + 0x18));
      pDVar2 = (this_00->scene).wp.d;
      if (event[0xb] == (QMouseEvent)0x1) {
        if (pDVar2 == (Data *)0x0) {
          pQVar8 = (QObject *)0x0;
        }
        else if (*(int *)(pDVar2 + 4) == 0) {
          pQVar8 = (QObject *)0x0;
        }
        else {
          pQVar8 = (this_00->scene).wp.value;
        }
        qt_sendSpontaneousEvent(pQVar8,(QEvent *)local_58);
      }
      else {
        if (pDVar2 == (Data *)0x0) {
          pQVar8 = (QObject *)0x0;
        }
        else if (*(int *)(pDVar2 + 4) == 0) {
          pQVar8 = (QObject *)0x0;
        }
        else {
          pQVar8 = (this_00->scene).wp.value;
        }
        QCoreApplication::sendEvent(pQVar8,(QEvent *)local_58);
      }
      cVar4 = cStack_4c;
      (**(code **)(*(long *)event + 0x10))(event,cStack_4c);
      (**(code **)(*(long *)&pQVar1->field_0 + 0x10))(pQVar1,cVar4);
      QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_58);
      if (cVar4 != '\0') goto LAB_005c00cd;
    }
  }
  if (this_00->dragMode == ScrollHandDrag) {
    if (*(int *)(event + 0x40) == 1) {
      event[0xc] = (QMouseEvent)0x1;
      this_00->field_0x301 = this_00->field_0x301 | 2;
      this_00->handScrollMotions = 0;
      pQVar7 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QCursor::QCursor((QCursor *)local_58,ClosedHandCursor);
      QWidget::setCursor(pQVar7,(QCursor *)local_58);
      QCursor::~QCursor((QCursor *)local_58);
    }
  }
  else if (((this_00->dragMode == RubberBandDrag) && (this_00->rubberBanding == false)) &&
          ((this_00->field_0x300 & 1) != 0)) {
    event[0xc] = (QMouseEvent)0x1;
    this_00->rubberBanding = true;
    (this_00->rubberBandRect).x1 = 0;
    (this_00->rubberBandRect).y1 = 0;
    (this_00->rubberBandRect).x2 = -1;
    (this_00->rubberBandRect).y2 = -1;
    bVar5 = QPointer::operator_cast_to_bool((QPointer *)&this_00->scene);
    if (bVar5) {
      if (((byte)event[0x23] & 4) == 0) {
        this_00->rubberBandSelectionOperation = ReplaceSelection;
        QGraphicsScene::clearSelection((QGraphicsScene *)(this_00->scene).wp.value);
      }
      else {
        this_00->rubberBandSelectionOperation = AddToSelection;
      }
    }
  }
LAB_005c00cd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::mousePressEvent(QMouseEvent *event)
{
    Q_D(QGraphicsView);

    // Store this event for replaying, finding deltas, and for
    // scroll-dragging; even in non-interactive mode, scroll hand dragging is
    // allowed, so we store the event at the very top of this function.
    d->storeMouseEvent(event);
    d->lastMouseEvent->setAccepted(false);

    if (d->sceneInteractionAllowed) {
        // Store some of the event's button-down data.
        d->mousePressViewPoint = event->position().toPoint();
        d->mousePressScenePoint = mapToScene(d->mousePressViewPoint);
        d->mousePressScreenPoint = event->globalPosition().toPoint();
        d->lastMouseMoveScenePoint = d->mousePressScenePoint;
        d->lastMouseMoveScreenPoint = d->mousePressScreenPoint;
        d->mousePressButton = event->button();

        if (d->scene) {
            // Convert and deliver the mouse event to the scene.
            QGraphicsSceneMouseEvent mouseEvent(QEvent::GraphicsSceneMousePress);
            mouseEvent.setWidget(viewport());
            mouseEvent.setButtonDownScenePos(d->mousePressButton, d->mousePressScenePoint);
            mouseEvent.setButtonDownScreenPos(d->mousePressButton, d->mousePressScreenPoint);
            mouseEvent.setScenePos(d->mousePressScenePoint);
            mouseEvent.setScreenPos(d->mousePressScreenPoint);
            mouseEvent.setLastScenePos(d->lastMouseMoveScenePoint);
            mouseEvent.setLastScreenPos(d->lastMouseMoveScreenPoint);
            mouseEvent.setButtons(event->buttons());
            mouseEvent.setButton(event->button());
            mouseEvent.setModifiers(event->modifiers());
            mouseEvent.setSource(event->source());
            mouseEvent.setFlags(event->flags());
            mouseEvent.setAccepted(false);
            mouseEvent.setTimestamp(event->timestamp());
            if (event->spontaneous())
                qt_sendSpontaneousEvent(d->scene, &mouseEvent);
            else
                QCoreApplication::sendEvent(d->scene, &mouseEvent);

            // Update the original mouse event accepted state.
            bool isAccepted = mouseEvent.isAccepted();
            event->setAccepted(isAccepted);

            // Update the last mouse event accepted state.
            d->lastMouseEvent->setAccepted(isAccepted);

            if (isAccepted)
                return;
        }
    }

#if QT_CONFIG(rubberband)
    if (d->dragMode == QGraphicsView::RubberBandDrag && !d->rubberBanding) {
        if (d->sceneInteractionAllowed) {
            // Rubberbanding is only allowed in interactive mode.
            event->accept();
            d->rubberBanding = true;
            d->rubberBandRect = QRect();
            if (d->scene) {
                bool extendSelection = (event->modifiers() & Qt::ControlModifier) != 0;

                if (extendSelection) {
                    d->rubberBandSelectionOperation = Qt::AddToSelection;
                } else {
                    d->rubberBandSelectionOperation = Qt::ReplaceSelection;
                    d->scene->clearSelection();
                }
            }
        }
    } else
#endif
        if (d->dragMode == QGraphicsView::ScrollHandDrag && event->button() == Qt::LeftButton) {
            // Left-button press in scroll hand mode initiates hand scrolling.
            event->accept();
            d->handScrolling = true;
            d->handScrollMotions = 0;
#ifndef QT_NO_CURSOR
            viewport()->setCursor(Qt::ClosedHandCursor);
#endif
        }
}